

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexAttrib.cpp
# Opt level: O1

bool rr::isValidVertexAttrib(VertexAttrib *vertexAttrib)

{
  VertexAttribType VVar1;
  bool bVar2;
  
  VVar1 = vertexAttrib->type;
  if (VERTEXATTRIBTYPE_DONT_CARE < VVar1) {
    return false;
  }
  bVar2 = false;
  if (((uint)vertexAttrib->size < 5) && (-1 < vertexAttrib->instanceDivisor)) {
    if ((VVar1 != VERTEXATTRIBTYPE_DONT_CARE) && (vertexAttrib->pointer == (void *)0x0)) {
      return false;
    }
    if (((VVar1 < VERTEXATTRIBTYPE_DONT_CARE) && ((0x380c08880U >> ((ulong)VVar1 & 0x3f) & 1) != 0))
       && (vertexAttrib->size != 4)) {
      return false;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool isValidVertexAttrib (const VertexAttrib& vertexAttrib)
{
	// Trivial range checks.
	if (!de::inBounds<int>(vertexAttrib.type, 0, VERTEXATTRIBTYPE_LAST) ||
		!de::inRange(vertexAttrib.size, 0, 4) ||
		vertexAttrib.instanceDivisor < 0)
		return false;

	// Generic attributes
	if (!vertexAttrib.pointer && vertexAttrib.type != VERTEXATTRIBTYPE_DONT_CARE)
		return false;

	// Packed formats
	if ((vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_INT_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UINT_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV				||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_UNORM_2_10_10_10_REV_BGRA		||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_CLAMP_BGRA	||
		 vertexAttrib.type == VERTEXATTRIBTYPE_NONPURE_SNORM_2_10_10_10_REV_SCALE_BGRA)	&&
		vertexAttrib.size != 4)
		return false;

	return true;
}